

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::move
          (basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *this,
          basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *other)

{
  char *pcVar1;
  size_t sVar2;
  size_t buf_capacity;
  basic_buffer<char> *in_RSI;
  basic_buffer<char> *in_RDI;
  size_t capacity;
  size_t size;
  char *data;
  allocator_ref<std::allocator<char>_> *other_alloc;
  allocator_ref<std::allocator<char>_> *this_alloc;
  allocator_ref<std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_buffer<char> *in_stack_ffffffffffffffb0;
  
  allocator_ref<std::allocator<char>_>::operator=
            ((allocator_ref<std::allocator<char>_> *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  pcVar1 = internal::basic_buffer<char>::data(in_RSI);
  sVar2 = internal::basic_buffer<char>::size(in_RSI);
  buf_capacity = internal::basic_buffer<char>::capacity(in_RSI);
  if ((char **)pcVar1 == &in_RSI[1].ptr_) {
    internal::basic_buffer<char>::set(in_RDI,(char *)&in_RDI[1].ptr_,buf_capacity);
    in_stack_ffffffffffffffb0 = (basic_buffer<char> *)&in_RSI[1].ptr_;
    pcVar1 = (char *)((long)&in_RSI[1].ptr_ + sVar2);
    internal::make_checked<char>((char *)&in_RDI[1].ptr_,buf_capacity);
    std::uninitialized_copy<char*,char*>((char *)in_RDI,pcVar1,(char *)in_stack_ffffffffffffffb0);
  }
  else {
    internal::basic_buffer<char>::set(in_RDI,pcVar1,buf_capacity);
    internal::basic_buffer<char>::set(in_RSI,(char *)&in_RSI[1].ptr_,0);
  }
  internal::basic_buffer<char>::resize(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void move(basic_memory_buffer &other) {
    Allocator &this_alloc = *this, &other_alloc = other;
    this_alloc = std::move(other_alloc);
    T* data = other.data();
    std::size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      std::uninitialized_copy(other.store_, other.store_ + size,
                              internal::make_checked(store_, capacity));
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
    }
    this->resize(size);
  }